

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O3

string * __thiscall
filesystem::path::extension_abi_cxx11_(string *__return_storage_ptr__,path *this)

{
  long lVar1;
  string local_30;
  
  filename_abi_cxx11_(&local_30,this);
  lVar1 = std::__cxx11::string::find_last_of((char *)&local_30,0x54b6b1,0xffffffffffffffff);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string extension() const {
        const std::string &name = filename();
        size_t pos = name.find_last_of(".");
        if (pos == std::string::npos)
            return "";
        return name.substr(pos+1);
    }